

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O2

double doublerand(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  lVar1 = random();
  lVar2 = random();
  uVar3 = random();
  dVar5 = (double)(lVar1 + -0x40000000) * 8388608.0 + (double)(lVar2 >> 8);
  dVar6 = 2.0;
  for (uVar4 = 0x200; uVar4 < 0x20001; uVar4 = uVar4 * 2) {
    if ((uVar4 & uVar3) != 0) {
      dVar5 = dVar5 * dVar6;
    }
    dVar6 = dVar6 * dVar6;
  }
  return dVar5;
}

Assistant:

double doublerand()
{
  double result;
  double expo;
  long a, b, c;
  long i;

  a = random();
  b = random();
  c = random();
  result = (double) (a - 1073741824) * 8388608.0 + (double) (b >> 8);
  for (i = 512, expo = 2; i <= 131072; i *= 2, expo = expo * expo) {
    if (c & i) {
      result *= expo;
    }
  }
  return result;
}